

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-trait.c
# Opt level: O2

void borg_notice(_Bool notice_swap)

{
  int *piVar1;
  borg_item *pbVar2;
  uint8_t uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  player_race *ppVar20;
  player_class *ppVar21;
  short *psVar22;
  object *poVar23;
  undefined1 auVar24 [13];
  undefined1 auVar25 [13];
  undefined1 auVar26 [14];
  undefined1 auVar27 [13];
  undefined1 auVar28 [14];
  player *p;
  _Bool _Var29;
  _Bool _Var30;
  int16_t iVar31;
  short sVar32;
  ushort uVar33;
  uint uVar34;
  int iVar35;
  wchar_t wVar36;
  wchar_t wVar37;
  undefined8 uVar38;
  angband_constants *paVar39;
  int iVar40;
  long lVar41;
  int *piVar42;
  long lVar43;
  int iVar44;
  ulong uVar45;
  bitflag *flags;
  long lVar46;
  borg_item_conflict *pbVar47;
  uint uVar48;
  uint uVar49;
  ulong uVar50;
  undefined8 uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  bitflag f [5];
  int local_74;
  int local_70;
  int local_6c;
  int16_t aiStack_3a [5];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined2 uVar58;
  
  memset(borg.has,0,(ulong)z_info->k_max << 2);
  memset(borg.trait,0,0x424);
  memset(borg.activation,0,(ulong)z_info->act_max << 2);
  piVar42 = borg.trait;
  borg.trait[0x92] = 1;
  piVar42[0x2c] = 0x6e;
  piVar42[0x98] = -1;
  piVar42[0x99] = 4;
  borg_notice_player();
  if (borg_do_spell == true) {
    borg_cheat_spells();
    borg_do_spell = false;
  }
  piVar42 = borg.trait;
  p = player;
  ppVar20 = player->race;
  ppVar21 = player->class;
  borg.trait[0x34] = ppVar20->infra;
  piVar42[0x36] = ppVar21->c_skills[0] + ppVar20->r_skills[0];
  piVar42[0x37] = ppVar21->c_skills[1] + ppVar20->r_skills[1];
  piVar42[0x38] = ppVar21->c_skills[2] + ppVar20->r_skills[2];
  piVar42[0x39] = ppVar21->c_skills[3] + ppVar20->r_skills[3];
  piVar42[0x3a] = ppVar21->c_skills[5] + ppVar20->r_skills[5];
  piVar42[0x3b] = ppVar21->c_skills[4] + ppVar20->r_skills[4];
  piVar42[0x3c] = ppVar21->c_skills[6] + ppVar20->r_skills[6];
  piVar42[0x3d] = ppVar21->c_skills[7] + ppVar20->r_skills[7];
  piVar42[0x3e] = ppVar21->c_skills[8] + ppVar20->r_skills[8];
  piVar42[0x3f] = ppVar21->c_skills[9] + ppVar20->r_skills[9];
  player_flags(p,f);
  _Var29 = flag_has_dbg(f,5,10,"f","OF_SLOW_DIGEST");
  if (_Var29) {
    borg.trait[0x30] = 1;
  }
  _Var29 = flag_has_dbg(f,5,0xb,"f","OF_FEATHER");
  if (_Var29) {
    borg.trait[0x31] = 1;
  }
  _Var29 = flag_has_dbg(f,5,0xc,"f","OF_REGEN");
  if (_Var29) {
    borg.trait[0x32] = 1;
  }
  _Var29 = flag_has_dbg(f,5,0xd,"f","OF_TELEPATHY");
  if (_Var29) {
    borg.trait[0x25] = 1;
  }
  _Var29 = flag_has_dbg(f,5,0xe,"f","OF_SEE_INVIS");
  if (_Var29) {
    borg.trait[0x33] = 1;
  }
  _Var29 = flag_has_dbg(f,5,0xf,"f","OF_FREE_ACT");
  if (_Var29) {
    borg.trait[0x56] = 1;
  }
  _Var29 = flag_has_dbg(f,5,0x10,"f","OF_HOLD_LIFE");
  if (_Var29) {
    borg.trait[0x55] = 1;
  }
  _Var29 = flag_has_dbg(f,5,0x11,"f","OF_IMPACT");
  if (_Var29) {
    borg.trait[0xcc] = 1;
  }
  _Var29 = flag_has_dbg(f,5,0x1a,"f","OF_AGGRAVATE");
  if (_Var29) {
    borg.trait[0xae] = 1;
  }
  _Var29 = flag_has_dbg(f,5,0x18,"f","OF_AFRAID");
  if (_Var29) {
    borg.trait[0xba] = 1;
  }
  _Var29 = flag_has_dbg(f,5,0x1b,"f","OF_DRAIN_EXP");
  if (_Var29) {
    borg.trait[0xbb] = 1;
  }
  sVar4 = ppVar20->el_info[2].res_level;
  if (sVar4 == -1) {
    borg.trait[0xbc] = 1;
  }
  sVar5 = ppVar20->el_info[0].res_level;
  if (sVar5 == -1) {
    borg.trait[0xbf] = 1;
  }
  sVar32 = ppVar20->el_info[3].res_level;
  if (sVar32 == -1) {
    borg.trait[0xbe] = 1;
  }
  sVar6 = ppVar20->el_info[1].res_level;
  if (sVar6 == -1) {
    borg.trait[0xbd] = 1;
  }
  if (sVar4 == 3) {
    borg.trait[0x40] = 1;
  }
  if (sVar5 == 3) {
    borg.trait[0x41] = 1;
  }
  if (sVar32 == 3) {
    borg.trait[0x42] = 1;
  }
  if (sVar6 == 3) {
    borg.trait[0x43] = 1;
  }
  if (0 < sVar4) {
    borg.trait[0x48] = 1;
  }
  if (0 < sVar6) {
    borg.trait[0x47] = 1;
  }
  if (0 < sVar4) {
    borg.trait[0x45] = 1;
  }
  if (0 < sVar32) {
    borg.trait[0x46] = 1;
  }
  if (0 < ppVar20->el_info[4].res_level) {
    borg.trait[0x49] = 1;
  }
  if (0 < ppVar20->el_info[5].res_level) {
    borg.trait[0x4b] = 1;
  }
  if (0 < ppVar20->el_info[6].res_level) {
    borg.trait[0x4c] = 1;
  }
  if (0 < ppVar20->el_info[7].res_level) {
    borg.trait[0x4f] = 1;
  }
  if (0 < ppVar20->el_info[8].res_level) {
    borg.trait[0x50] = 1;
  }
  if (0 < ppVar20->el_info[9].res_level) {
    borg.trait[0x51] = 1;
  }
  if (0 < ppVar20->el_info[10].res_level) {
    borg.trait[0x52] = 1;
  }
  if (0 < ppVar20->el_info[0xb].res_level) {
    borg.trait[0x53] = 1;
  }
  if (0 < ppVar20->el_info[0xc].res_level) {
    borg.trait[0x54] = 1;
  }
  _Var29 = flag_has_dbg(f,0xb,6,"f","OF_PROT_FEAR");
  if (_Var29) {
    borg.trait[0x4a] = 1;
  }
  _Var29 = flag_has_dbg(f,0xb,7,"f","OF_PROT_BLIND");
  if (_Var29) {
    borg.trait[0x4d] = 1;
  }
  _Var29 = flag_has_dbg(f,0xb,8,"f","OF_PROT_CONF");
  if (_Var29) {
    borg.trait[0x4e] = 1;
  }
  _Var29 = flag_has_dbg(f,0xb,1,"f","OF_SUST_STR");
  if (_Var29) {
    borg.trait[0x14] = 1;
  }
  _Var29 = flag_has_dbg(f,0xb,2,"f","OF_SUST_INT");
  if (_Var29) {
    borg.trait[0x15] = 1;
  }
  _Var29 = flag_has_dbg(f,0xb,3,"f","OF_SUST_WIS");
  if (_Var29) {
    borg.trait[0x16] = 1;
  }
  _Var29 = flag_has_dbg(f,0xb,4,"f","OF_SUST_DEX");
  if (_Var29) {
    borg.trait[0x17] = 1;
  }
  _Var29 = flag_has_dbg(f,0xb,5,"f","OF_SUST_CON");
  if (_Var29) {
    borg.trait[0x18] = 1;
  }
  psVar22 = player->timed;
  iVar40 = 10;
  if (((*psVar22 != 0) || (psVar22[0x1d] != 0)) || (iVar40 = 5, psVar22[0x1c] != 0)) {
    borg.trait[0x2c] = borg.trait[0x2c] + iVar40;
  }
  piVar42 = borg.activation;
  pbVar47 = borg_items;
  uVar45 = (ulong)z_info->pack_size;
  lVar46 = uVar45 * 0x388;
  for (lVar43 = 0x6c; lVar43 != 0x2acc; lVar43 = lVar43 + 0x388) {
    if ((long)*(int *)(pbVar47[uVar45].desc + lVar43) != 0) {
      piVar1 = piVar42 + *(int *)(pbVar47[uVar45].desc + lVar43);
      *piVar1 = *piVar1 + 1;
    }
  }
  if (piVar42[act_staff_magi] != 0) {
    borg.trait[0xdb] = borg.trait[0xdb] + 10;
  }
  local_6c = 0;
  local_74 = 0x1e;
  local_70 = 0;
  uVar50 = uVar45;
  for (; piVar42 = borg.trait, pbVar47 = borg_items, uVar45 < uVar50 + 0xc; uVar45 = uVar45 + 1) {
    if (borg_items->curses[lVar46 + -0x26] != false) {
      if ((borg_items->curses[lVar46 + -1] == true) &&
         (borg.trait[0xa0] = borg.trait[0xa0] | 2, piVar42[0x9f] == 0)) {
        piVar42[0x9f] = (int)uVar45 + 1;
      }
      pbVar2 = (borg_item *)(pbVar47->desc + lVar46);
      _Var29 = cursed_nonartifact(pbVar2);
      if (!_Var29) {
        iVar31 = borg_item_weight((borg_item_conflict *)pbVar2);
        borg.trait[0x104] = borg.trait[0x104] + (int)iVar31;
        _Var29 = borg_item_note_needs_id((borg_item_conflict *)pbVar2);
        piVar42 = borg.trait;
        if (_Var29) {
          *(ulong *)(borg.trait + 0xfd) =
               CONCAT44((int)((ulong)*(undefined8 *)(borg.trait + 0xfd) >> 0x20) + 1,
                        (int)*(undefined8 *)(borg.trait + 0xfd) + 1);
        }
        poVar23 = player->obj_k;
        uVar50 = *(ulong *)((long)pbVar47->modifiers + lVar46);
        auVar26._8_4_ = 0;
        auVar26._0_8_ = uVar50;
        auVar26._12_2_ = (short)(uVar50 >> 0x30);
        auVar28._8_2_ = (short)(uVar50 >> 0x20);
        auVar28._0_8_ = uVar50;
        auVar28._10_4_ = auVar26._10_4_;
        auVar56._6_10_ = SUB1610(ZEXT616(auVar28._8_6_) << 0x40,6);
        auVar56._4_2_ = (short)(uVar50 >> 0x10);
        auVar56._0_2_ = (ushort)uVar50;
        auVar56._2_2_ = 0;
        uVar50 = *(ulong *)poVar23->modifiers;
        uVar58 = (undefined2)(uVar50 >> 0x30);
        auVar55._8_4_ = 0;
        auVar55._0_8_ = uVar50;
        auVar55._12_2_ = uVar58;
        auVar55._14_2_ = uVar58;
        uVar58 = (undefined2)(uVar50 >> 0x20);
        auVar54._12_4_ = auVar55._12_4_;
        auVar54._8_2_ = 0;
        auVar54._0_8_ = uVar50;
        auVar54._10_2_ = uVar58;
        auVar53._10_6_ = auVar54._10_6_;
        auVar53._8_2_ = uVar58;
        auVar53._0_8_ = uVar50;
        uVar58 = (undefined2)(uVar50 >> 0x10);
        auVar52._8_8_ = auVar53._8_8_;
        auVar52._6_2_ = uVar58;
        auVar52._4_2_ = uVar58;
        auVar52._0_2_ = (undefined2)uVar50;
        auVar52._2_2_ = auVar52._0_2_;
        auVar56 = pmaddwd(auVar52,auVar56);
        piVar42[5] = piVar42[5] + auVar56._0_4_;
        piVar42[6] = piVar42[6] + auVar56._4_4_;
        piVar42[7] = piVar42[7] + auVar56._8_4_;
        piVar42[8] = piVar42[8] + auVar56._12_4_;
        piVar42[9] = piVar42[9] +
                     (int)poVar23->modifiers[4] *
                     (int)*(short *)((long)pbVar47->modifiers + lVar46 + 8);
        piVar42[0xc1] = *(int *)((long)pbVar47->slays + lVar46 + 0xf0);
        piVar42[0xc2] = *(int *)((long)pbVar47->slays + lVar46 + 0xf4);
        piVar42[0xc3] = *(int *)((long)pbVar47->slays + lVar46 + 0xf8);
        piVar42[0xc4] = *(int *)((long)pbVar47->slays + lVar46 + 0xec);
        piVar42[0xc5] = *(int *)((long)pbVar47->slays + lVar46 + 0xdc);
        piVar42[0xc6] = *(int *)((long)pbVar47->slays + lVar46 + 0xe0);
        piVar42[199] = *(int *)((long)pbVar47->slays + lVar46 + 0xe4);
        piVar42[200] = *(int *)((long)pbVar47->slays + lVar46 + 0xe8);
        if (pbVar47->brands[lVar46] == true) {
          piVar42[0xcd] = 1;
        }
        if (pbVar47->brands[lVar46 + 1] == true) {
          piVar42[0xce] = 1;
        }
        if (pbVar47->brands[lVar46 + 2] == true) {
          piVar42[0xcf] = 1;
        }
        if (pbVar47->brands[lVar46 + 3] == true) {
          piVar42[0xd0] = 1;
        }
        if (pbVar47->brands[lVar46 + 4] == true) {
          piVar42[0xd1] = 1;
        }
        flags = pbVar47->flags + lVar46;
        _Var29 = flag_has_dbg(flags,5,0x11,"item->flags","OF_IMPACT");
        piVar42 = borg.trait;
        if (_Var29) {
          borg.trait[0xcc] = 1;
        }
        piVar42[0x34] = piVar42[0x34] + (int)*(short *)((long)pbVar47->modifiers + lVar46 + 0xe);
        piVar42[0x3a] = piVar42[0x3a] + (int)*(short *)((long)pbVar47->modifiers + lVar46 + 10);
        piVar42[0x3b] = piVar42[0x3b] + *(short *)((long)pbVar47->modifiers + lVar46 + 0xc) * 5;
        iVar40 = 0;
        if (pbVar47->curses[lVar46 + -0x2a] == true) {
          _Var29 = flag_has_dbg(flags,5,0x20,"item->flags","OF_DIG_1");
          iVar40 = 1;
          if (!_Var29) {
            _Var29 = flag_has_dbg(flags,5,0x21,"item->flags","OF_DIG_2");
            iVar40 = 2;
            if (!_Var29) {
              _Var29 = flag_has_dbg(flags,5,0x22,"item->flags","OF_DIG_3");
              iVar40 = (uint)_Var29 + (uint)_Var29 * 2;
            }
          }
        }
        piVar42 = borg.trait;
        borg.trait[0x3f] =
             borg.trait[0x3f] +
             (*(short *)((long)pbVar47->modifiers + lVar46 + 0x10) + iVar40) * 0x14;
        piVar42[0x2c] = piVar42[0x2c] + (int)*(short *)((long)pbVar47->modifiers + lVar46 + 0x12);
        if (uVar45 != z_info->pack_size) {
          piVar42[0x93] = piVar42[0x93] + (int)*(short *)((long)pbVar47->modifiers + lVar46 + 0x14);
        }
        sVar4 = *(short *)((long)pbVar47->modifiers + lVar46 + 0x16);
        sVar5 = *(short *)((long)pbVar47->modifiers + lVar46 + 0x18);
        piVar42[0x1a] = piVar42[0x1a] + (int)*(short *)((long)pbVar47->modifiers + lVar46 + 0x1a);
        _Var29 = flag_has_dbg(flags,5,0x1e,"item->flags","OF_LIGHT_2");
        iVar40 = 2;
        if (_Var29) {
LAB_002388c4:
          borg.trait[0x1a] = borg.trait[0x1a] + iVar40;
        }
        else {
          _Var29 = flag_has_dbg(flags,5,0x1f,"item->flags","OF_LIGHT_3");
          iVar40 = 3;
          if (_Var29) goto LAB_002388c4;
        }
        sVar32 = *(short *)((long)pbVar47->modifiers + lVar46 + 0x1a);
        if ((0 < sVar32) && (borg.trait[0x19] == 4)) {
          borg.trait[0x1a] = borg.trait[0x1a] + -1;
        }
        if (uVar45 == (ulong)z_info->pack_size + 5) {
          if (*(short *)(pbVar47->curses + lVar46 + -0x18) == 0) {
            _Var29 = flag_has_dbg(flags,5,0x15,"item->flags","OF_NO_FUEL");
            if (!_Var29) goto LAB_0023893c;
            sVar32 = *(short *)((long)pbVar47->modifiers + lVar46 + 0x1a);
          }
          borg.trait[0x1a] = borg.trait[0x1a] + (int)sVar32;
        }
LAB_0023893c:
        piVar42 = borg.trait;
        auVar56 = ZEXT416(*(uint *)((long)pbVar47->modifiers + lVar46 + 0x1c));
        auVar56 = pshuflw(auVar56,auVar56,4);
        uVar38 = *(undefined8 *)(borg.trait + 0x2e);
        borg.trait[0x2e] = (int)uVar38 + (auVar56._0_4_ >> 0x10);
        piVar42[0x2f] = (int)((ulong)uVar38 >> 0x20) + (auVar56._4_4_ >> 0x10);
        _Var29 = flag_has_dbg(flags,5,10,"item->flags","OF_SLOW_DIGEST");
        if (_Var29) {
          borg.trait[0x30] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,0x1a,"item->flags","OF_AGGRAVATE");
        if (_Var29) {
          borg.trait[0xae] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,0x16,"item->flags","OF_IMPAIR_HP");
        if (_Var29) {
          borg.trait[0xb6] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,0x17,"item->flags","OF_IMPAIR_MANA");
        if (_Var29) {
          borg.trait[0xb7] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,0x18,"item->flags","OF_AFRAID");
        if (_Var29) {
          borg.trait[0xba] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,0x1b,"item->flags","OF_DRAIN_EXP");
        if (_Var29) {
          borg.trait[0xbb] = 1;
        }
        if (pbVar47->curses[lVar46 + 1] == true) {
          borg.trait[0xaf] = 1;
        }
        if (pbVar47->curses[lVar46 + 2] == true) {
          borg.trait[0xa3] = 1;
        }
        if (pbVar47->curses[lVar46 + 3] == true) {
          borg.trait[0xb0] = 1;
        }
        if (pbVar47->curses[lVar46 + 4] == true) {
          borg.trait[0xb1] = 1;
        }
        if (pbVar47->curses[lVar46 + 5] == true) {
          borg.trait[0xa1] = 1;
        }
        piVar42 = borg.trait;
        if (pbVar47->curses[lVar46 + 6] == true) {
          borg.trait[0xae] = 1;
          piVar42[0xa2] = 1;
        }
        if (pbVar47->curses[lVar46 + 7] == true) {
          borg.trait[0xb2] = 1;
        }
        if (pbVar47->curses[lVar46 + 8] == true) {
          borg.trait[0xb3] = 1;
        }
        if (pbVar47->curses[lVar46 + 9] == true) {
          borg.trait[0xb4] = 1;
        }
        if (pbVar47->curses[lVar46 + 10] == true) {
          borg.trait[0xb5] = 1;
        }
        if (pbVar47->curses[lVar46 + 0xb] == true) {
          borg.trait[0xa4] = 1;
        }
        if (pbVar47->curses[lVar46 + 0xc] == true) {
          borg.trait[0xa5] = 1;
        }
        if (pbVar47->curses[lVar46 + 0xd] == true) {
          borg.trait[0xa6] = 1;
        }
        if (pbVar47->curses[lVar46 + 0xe] == true) {
          borg.trait[0xa7] = 1;
        }
        if (pbVar47->curses[lVar46 + 0x10] == true) {
          borg.trait[0xa8] = 1;
        }
        if (pbVar47->curses[lVar46 + 0xf] == true) {
          borg.trait[0xa9] = 1;
        }
        if (pbVar47->curses[lVar46 + 0x11] == true) {
          borg.trait[0xaa] = 1;
        }
        if (pbVar47->curses[lVar46 + 0x12] == true) {
          borg.trait[0xb7] = 1;
        }
        if (pbVar47->curses[lVar46 + 0x13] == true) {
          borg.trait[0xb6] = 1;
        }
        if (pbVar47->curses[lVar46 + 0x14] == true) {
          borg.trait[0xba] = 1;
        }
        if (pbVar47->curses[lVar46 + 0x15] == true) {
          borg.trait[0xab] = 1;
        }
        if (pbVar47->curses[lVar46 + 0x16] == true) {
          borg.trait[0xac] = 1;
        }
        if (pbVar47->curses[lVar46 + 0x17] == true) {
          borg.trait[0xad] = 1;
        }
        piVar42 = borg.trait;
        if (pbVar47->curses[lVar46 + 0x18] == true) {
          borg.trait[0xbc] = 1;
          piVar42[0x46] = 1;
        }
        piVar42 = borg.trait;
        if (pbVar47->curses[lVar46 + 0x19] == true) {
          borg.trait[0xbe] = 1;
          piVar42[0x45] = 1;
        }
        if (pbVar47->curses[lVar46 + 0x1a] == true) {
          borg.trait[0xb8] = 1;
        }
        if (pbVar47->curses[lVar46 + 0x1b] == true) {
          borg.trait[0xb9] = 1;
        }
        if (pbVar47->curses[lVar46] == true) {
          borg.trait[0xc0] = 1;
        }
        if (*(short *)((long)&pbVar47->el_info[2].res_level + lVar46) == -1) {
          borg.trait[0xbc] = 1;
        }
        if (*(short *)((long)&pbVar47->el_info[0].res_level + lVar46) == -1) {
          borg.trait[0xbf] = 1;
        }
        if (*(short *)((long)&pbVar47->el_info[3].res_level + lVar46) == -1) {
          borg.trait[0xbe] = 1;
        }
        if (*(short *)((long)&pbVar47->el_info[1].res_level + lVar46) == -1) {
          borg.trait[0xbd] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,0xc,"item->flags","OF_REGEN");
        if (_Var29) {
          borg.trait[0x32] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,0xd,"item->flags","OF_TELEPATHY");
        if (_Var29) {
          borg.trait[0x25] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,0xe,"item->flags","OF_SEE_INVIS");
        if (_Var29) {
          borg.trait[0x33] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,0xb,"item->flags","OF_FEATHER");
        if (_Var29) {
          borg.trait[0x31] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,0xf,"item->flags","OF_FREE_ACT");
        if (_Var29) {
          borg.trait[0x56] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,0x10,"item->flags","OF_HOLD_LIFE");
        if (_Var29) {
          borg.trait[0x55] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,8,"item->flags","OF_PROT_CONF");
        if (_Var29) {
          borg.trait[0x4e] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,7,"item->flags","OF_PROT_BLIND");
        if (_Var29) {
          borg.trait[0x4d] = 1;
        }
        piVar42 = borg.trait;
        sVar32 = *(short *)((long)&pbVar47->el_info[2].res_level + lVar46);
        if (sVar32 == 3) {
          borg.trait[0x40] = 1;
          piVar42[0x45] = 1;
          borg.temp.res_fire = true;
        }
        piVar42 = borg.trait;
        sVar6 = *(short *)((long)&pbVar47->el_info[0].res_level + lVar46);
        if (sVar6 == 3) {
          borg.trait[0x41] = 1;
          piVar42[0x48] = 1;
          borg.temp.res_acid = true;
        }
        piVar42 = borg.trait;
        sVar7 = *(short *)((long)&pbVar47->el_info[3].res_level + lVar46);
        if (sVar7 == 3) {
          borg.trait[0x42] = 1;
          piVar42[0x46] = 1;
          borg.temp.res_cold = true;
        }
        piVar42 = borg.trait;
        sVar8 = *(short *)((long)&pbVar47->el_info[1].res_level + lVar46);
        if (sVar8 == 3) {
          borg.trait[0x43] = 1;
          piVar42[0x47] = 1;
          borg.temp.res_elec = true;
        }
        if (0 < sVar6) {
          borg.trait[0x48] = 1;
        }
        if (0 < sVar8) {
          borg.trait[0x47] = 1;
        }
        if (0 < sVar32) {
          borg.trait[0x45] = 1;
        }
        if (0 < sVar7) {
          borg.trait[0x46] = 1;
        }
        if (0 < *(short *)((long)&pbVar47->el_info[4].res_level + lVar46)) {
          borg.trait[0x49] = 1;
        }
        if (0 < *(short *)((long)&pbVar47->el_info[7].res_level + lVar46)) {
          borg.trait[0x4f] = 1;
        }
        if (0 < *(short *)((long)&pbVar47->el_info[5].res_level + lVar46)) {
          borg.trait[0x4b] = 1;
        }
        if (0 < *(short *)((long)&pbVar47->el_info[6].res_level + lVar46)) {
          borg.trait[0x4c] = 1;
        }
        if (0 < *(short *)((long)&pbVar47->el_info[0xb].res_level + lVar46)) {
          borg.trait[0x53] = 1;
        }
        if (0 < *(short *)((long)&pbVar47->el_info[0xc].res_level + lVar46)) {
          borg.trait[0x54] = 1;
        }
        if (0 < *(short *)((long)&pbVar47->el_info[8].res_level + lVar46)) {
          borg.trait[0x50] = 1;
        }
        if (0 < *(short *)((long)&pbVar47->el_info[9].res_level + lVar46)) {
          borg.trait[0x51] = 1;
        }
        if (0 < *(short *)((long)&pbVar47->el_info[10].res_level + lVar46)) {
          borg.trait[0x52] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,1,"item->flags","OF_SUST_STR");
        if (_Var29) {
          borg.trait[0x14] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,2,"item->flags","OF_SUST_INT");
        if (_Var29) {
          borg.trait[0x15] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,3,"item->flags","OF_SUST_WIS");
        if (_Var29) {
          borg.trait[0x16] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,4,"item->flags","OF_SUST_DEX");
        if (_Var29) {
          borg.trait[0x17] = 1;
        }
        _Var29 = flag_has_dbg(flags,5,5,"item->flags","OF_SUST_CON");
        if (_Var29) {
          borg.trait[0x18] = 1;
        }
        sVar32 = *(short *)((long)&pbVar47->el_info[4].res_level + lVar46);
        sVar6 = *(short *)((long)&pbVar47->el_info[7].res_level + lVar46);
        sVar7 = *(short *)((long)&pbVar47->el_info[8].res_level + lVar46);
        sVar8 = *(short *)((long)&pbVar47->el_info[9].res_level + lVar46);
        sVar9 = *(short *)((long)&pbVar47->el_info[10].res_level + lVar46);
        sVar10 = *(short *)((long)&pbVar47->el_info[0xb].res_level + lVar46);
        sVar11 = *(short *)((long)&pbVar47->el_info[0xc].res_level + lVar46);
        uVar34 = 0;
        if (((0 < *(short *)((long)&pbVar47->el_info[2].res_level + lVar46)) &&
            (0 < *(short *)((long)&pbVar47->el_info[3].res_level + lVar46))) &&
           (0 < *(short *)((long)&pbVar47->el_info[1].res_level + lVar46))) {
          uVar34 = (uint)(0 < *(short *)((long)&pbVar47->el_info[0].res_level + lVar46));
        }
        _Var29 = flag_has_dbg(flags,5,1,"item->flags","OF_SUST_STR");
        if (((_Var29) && (_Var29 = flag_has_dbg(flags,5,2,"item->flags","OF_SUST_INT"), _Var29)) &&
           (_Var29 = flag_has_dbg(flags,5,3,"item->flags","OF_SUST_WIS"), _Var29)) {
          _Var29 = flag_has_dbg(flags,5,4,"item->flags","OF_SUST_DEX");
          uVar49 = 0;
          if (_Var29) {
            _Var29 = flag_has_dbg(flags,5,5,"item->flags","OF_SUST_CON");
            uVar49 = (uint)_Var29;
          }
        }
        else {
          uVar49 = 0;
        }
        uVar49 = (uint)(0 < sVar11) + (uint)(0 < sVar10) + (uint)(0 < sVar9) +
                 (uint)(0 < sVar8) + (uint)(0 < sVar7) + (uint)(0 < sVar6) + (uint)(0 < sVar32) +
                 uVar34 + uVar49;
        if (2 < uVar49) {
          borg.trait[0x102] = borg.trait[0x102] + uVar49;
        }
        if (((pbVar47->curses[lVar46 + -0x22] == false) &&
            (pbVar47->curses[lVar46 + -0x21] == false)) &&
           ((sVar32 = *(short *)(pbVar47->curses + lVar46 + -0x10), 0 < sVar32 &&
            (iVar40 = (int)*(short *)(pbVar47->curses + lVar46 + -0x12) + (int)sVar32,
            iVar40 == 0 ||
            SCARRY4((int)*(short *)(pbVar47->curses + lVar46 + -0x12),(int)sVar32) != iVar40 < 0))))
        {
          (pbVar47->curses + lVar46 + -0x12)[0] = true;
          (pbVar47->curses + lVar46 + -0x12)[1] = true;
        }
        piVar42 = borg.trait;
        local_70 = local_70 + sVar4;
        local_6c = local_6c + sVar5;
        borg.trait[0x85] =
             (int)*(short *)(pbVar47->curses + lVar46 + -0x12) +
             (int)*(short *)(pbVar47->curses + lVar46 + -0x10) + borg.trait[0x85];
        uVar50 = (ulong)z_info->pack_size;
        if ((uVar45 != uVar50) && (uVar45 != uVar50 + 1)) {
          auVar56 = pshuflw(ZEXT416(*(uint *)(pbVar47->curses + lVar46 + -0x16)),
                            ZEXT416(*(uint *)(pbVar47->curses + lVar46 + -0x16)),0x60);
          uVar38 = *(undefined8 *)(piVar42 + 0x86);
          piVar42[0x86] = (int)uVar38 + (auVar56._0_4_ >> 0x10);
          piVar42[0x87] = (int)((ulong)uVar38 >> 0x20) + (auVar56._4_4_ >> 0x10);
        }
      }
    }
    lVar46 = lVar46 + 0x388;
  }
  if ((borg.trait[0x19] == 4) && (borg.trait[0x1a] < 1)) {
    borg.trait[0x1a] = 1;
  }
  if (piVar42[0xaf] != 0) {
    piVar42[0xae] = 1;
    piVar42[0x85] = piVar42[0x85] + -0x32;
  }
  if (piVar42[0xb0] != 0) {
    *(ulong *)(piVar42 + 0xb) =
         CONCAT44((int)((ulong)*(undefined8 *)(piVar42 + 0xb) >> 0x20) + -5,
                  (int)*(undefined8 *)(piVar42 + 0xb) + -5);
  }
  if (piVar42[0xb1] != 0) {
    piVar42[10] = piVar42[10] + -5;
    *(ulong *)(piVar42 + 0xd) =
         CONCAT44((int)((ulong)*(undefined8 *)(piVar42 + 0xd) >> 0x20) + -5,
                  (int)*(undefined8 *)(piVar42 + 0xd) + -5);
  }
  if (piVar42[0xb2] != 0) {
    piVar42[10] = piVar42[10] + -10;
  }
  if (piVar42[0xb3] != 0) {
    piVar42[0xd] = piVar42[0xd] + -10;
  }
  if (piVar42[0xb4] != 0) {
    piVar42[0x2c] = piVar42[0x2c] + -5;
  }
  if (piVar42[0xb5] != 0) {
    piVar42[0x2c] = piVar42[0x2c] + -10;
    piVar42[0x3a] = piVar42[0x3a] + -10;
    piVar42[0xae] = 1;
  }
  for (lVar43 = 0; lVar43 != 5; lVar43 = lVar43 + 1) {
    aiStack_3a[lVar43] = player->stat_cur[lVar43];
  }
  for (lVar43 = 0; lVar43 != 10; lVar43 = lVar43 + 2) {
    sVar4 = *(short *)((long)aiStack_3a + lVar43);
    uVar33 = modify_stat_value((int)sVar4,
                               *(int *)((long)player->race->r_adj + lVar43 * 2) +
                               *(int *)((long)piVar42 + lVar43 * 2 + 0x14) +
                               *(int *)((long)player->class->c_adj + lVar43 * 2));
    piVar42 = borg.trait;
    iVar40 = (int)(short)uVar33;
    if ((short)uVar33 < 0x13) {
      iVar35 = iVar40 + -3;
    }
    else {
      iVar35 = 0x25;
      if (uVar33 < 0xee) {
        iVar35 = (iVar40 - 0x12U) / 10 + 0xf;
      }
    }
    *(int *)((long)borg.trait + lVar43 * 2 + 0x3c) = iVar35;
    *(int *)((long)piVar42 + lVar43 * 2) = iVar40;
    *(int *)((long)piVar42 + lVar43 * 2 + 0x28) = (int)sVar4;
  }
  piVar42[0x1d] =
       (piVar42[0x23] * borg_adj_con_mhp[piVar42[0x13]]) / 100 +
       (int)player->player_hp[(long)player->lev + -1];
  wVar36 = borg_spell_stat();
  piVar42 = borg.trait;
  if (L'\xffffffff' < wVar36) {
    borg.trait[0x20] =
         (((borg.trait[0x23] - (player->class->magic).spell_first) + 1) *
         borg_adj_mag_mana[borg.trait[(ulong)(uint)wVar36 + 0xf]]) / 2;
    piVar42[0x21] = borg_adj_mag_stat[piVar42[(ulong)(uint)wVar36 + 0xf]];
    piVar42[0x22] = borg_adj_mag_fail[piVar42[(ulong)(uint)wVar36 + 0xf]];
  }
  if (piVar42[0x6f] != 0) {
    piVar42[0x2c] = piVar42[0x2c] + -10;
  }
  piVar42[0x85] = piVar42[0x85] + borg_adj_dex_ta[piVar42[0x12]];
  iVar40 = piVar42[0xf];
  piVar42[0x87] = piVar42[0x87] + borg_adj_str_td[iVar40];
  iVar44 = piVar42[0x86] + borg_adj_dex_th[piVar42[0x12]] + borg_adj_str_th[iVar40];
  piVar42[0x86] = iVar44;
  iVar35 = adj_str_hold[iVar40];
  piVar42[0x3f] = piVar42[0x3f] + borg_adj_str_dig[iVar40];
  pbVar47 = borg_items;
  uVar45 = (ulong)z_info->pack_size;
  uVar3 = borg_items[uVar45 + 1].iqty;
  if ((uVar3 == '\0') ||
     (_Var29 = cursed_nonartifact((borg_item *)(borg_items + uVar45 + 1)), _Var29)) {
    pbVar47[uVar45 + 1].dd = '\0';
    pbVar47[uVar45 + 1].ds = '\0';
    pbVar47[uVar45 + 1].to_h = 0;
    pbVar47[uVar45 + 1].to_d = 0;
    pbVar47[uVar45 + 1].weight = 0;
    pbVar47[uVar45 + 1].ident = true;
    pbVar47[uVar45 + 1].sval = '\0';
    uVar38 = 0;
    uVar34 = 1;
    iVar40 = 0;
    wVar36 = L'\0';
  }
  else {
    uVar49._0_2_ = pbVar47[uVar45 + 1].to_h;
    uVar49._2_2_ = pbVar47[uVar45 + 1].to_d;
    uVar34 = (uint)pbVar47[uVar45 + 1].ident;
    wVar36 = (wchar_t)pbVar47[uVar45 + 1].sval;
    iVar40 = (int)(pbVar47[uVar45 + 1].weight / 10);
    auVar56 = pshuflw(ZEXT416(uVar49),ZEXT416(uVar49),0x60);
    uVar38 = CONCAT44(auVar56._4_4_ >> 0x10,auVar56._0_4_ >> 0x10);
  }
  *(undefined8 *)(piVar42 + 0x8e) = uVar38;
  piVar42[0x8d] = uVar34;
  wVar37 = sv_sling;
  piVar42[0x90] = (uint)(sv_sling == wVar36);
  piVar42[0x91] = (uint)pbVar47[uVar45 + 1].art_idx;
  if (iVar35 < iVar40) {
    piVar42[0x96] = 1;
    piVar42[0x86] = iVar44 + (iVar35 - iVar40) * 2;
LAB_00239883:
    iVar44 = 1;
  }
  else {
    if (uVar3 == '\0') goto LAB_00239883;
    if (wVar37 == wVar36) {
      piVar42[0x98] = 2;
      piVar42[0x99] = 3;
      iVar40 = 2;
    }
    else {
      uVar38 = 0x400000003;
      if (sv_short_bow == wVar36) {
        piVar42[0x98] = 3;
        piVar42[0x99] = 4;
        iVar40 = 2;
      }
      else if ((sv_long_bow == wVar36) || (uVar38 = 0x500000004, sv_light_xbow == wVar36)) {
        *(undefined8 *)(piVar42 + 0x98) = uVar38;
        iVar40 = 3;
      }
      else if (sv_heavy_xbow == wVar36) {
        piVar42[0x98] = 4;
        piVar42[0x99] = 5;
        iVar40 = 4;
      }
      else {
        iVar40 = piVar42[0x9a];
      }
    }
    piVar42[0x9a] = iVar40 + local_6c;
    _Var29 = flag_has_dbg((player->state).pflags,3,1,"player->state.pflags","(PF_FAST_SHOT)");
    piVar42 = borg.trait;
    iVar40 = 1;
    if (_Var29) {
      iVar40 = (uint)(0x13 < borg.trait[0x23] && borg.trait[0x98] == 3) +
               (uint)(0x27 < borg.trait[0x23]) + 1;
      borg.trait[0x35] = 1;
    }
    iVar44 = 1;
    if (1 < iVar40 + local_70) {
      iVar44 = iVar40 + local_70;
    }
    uVar45 = (ulong)z_info->pack_size;
    pbVar47 = borg_items;
  }
  piVar42[0x94] = iVar44;
  pbVar2 = (borg_item *)(pbVar47 + uVar45);
  uVar3 = pbVar47[uVar45].iqty;
  if ((uVar3 == '\0') || (_Var29 = cursed_nonartifact(pbVar2), _Var29)) {
    pbVar2->dd = '\0';
    pbVar2->ds = '\0';
    pbVar2->to_h = 0;
    pbVar2->to_d = 0;
    pbVar2->weight = 0;
    pbVar2->ident = true;
    uVar51 = 0;
    uVar34 = 1;
    iVar40 = 0;
    uVar38 = 0;
  }
  else {
    uVar48._0_2_ = pbVar2->to_h;
    uVar48._2_2_ = pbVar2->to_d;
    uVar34 = (uint)pbVar2->ident;
    uVar12._0_1_ = pbVar2->dd;
    uVar12._1_1_ = pbVar2->ds;
    uVar12._2_1_ = pbVar2->level;
    uVar12._3_1_ = pbVar2->field_0x7f;
    iVar40 = (int)(pbVar2->weight / 10);
    auVar56 = pshuflw(ZEXT416(uVar48),ZEXT416(uVar48),0x60);
    uVar51 = CONCAT44(auVar56._4_4_ >> 0x10,auVar56._0_4_ >> 0x10);
    auVar24[0xc] = uVar12._3_1_;
    auVar24._0_12_ = ZEXT712(0);
    auVar27[1] = 0;
    auVar27[0] = uVar12._2_1_;
    auVar27._2_3_ = auVar24._10_3_;
    auVar27._5_8_ = 0;
    auVar25[5] = 0;
    auVar25[4] = uVar12._1_1_;
    auVar25._6_7_ = SUB137(auVar27 << 0x40,6);
    auVar25._0_4_ = uVar12 & 0xff;
    uVar38 = auVar25._0_8_;
  }
  *(undefined8 *)(piVar42 + 0x88) = uVar51;
  piVar42[0x8a] = uVar34;
  *(undefined8 *)(piVar42 + 0x8b) = uVar38;
  if (iVar35 < iVar40) {
    piVar42[0x95] = 1;
    iVar40 = (iVar35 - iVar40) * 2;
    lVar43 = 0x218;
LAB_00239a46:
    *(int *)((long)piVar42 + lVar43) = *(int *)((long)piVar42 + lVar43) + iVar40;
  }
  else if (uVar3 != '\0') {
    wVar36 = borg_calc_blows(pbVar2);
    piVar42[0x92] = wVar36;
    lVar43 = 0xfc;
    goto LAB_00239a46;
  }
  _Var29 = flag_has_dbg((player->state).pflags,3,2,"player->state.pflags","(PF_BRAVERY_30)");
  piVar42 = borg.trait;
  if ((_Var29) && (0x1d < borg.trait[0x23])) {
    borg.trait[0x4a] = 1;
  }
  iVar40 = piVar42[0x3a];
  piVar42[0x3a] = iVar40 + 1;
  iVar35 = piVar42[0x24];
  iVar44 = piVar42[0x36];
  iVar13 = borg_adj_dex_dis[piVar42[0x12]];
  piVar42[0x36] = iVar44 + iVar13;
  iVar14 = piVar42[0x37];
  iVar15 = borg_adj_dex_dis[piVar42[0x10]];
  piVar42[0x37] = iVar14 + iVar15;
  iVar16 = piVar42[0x38];
  iVar17 = borg_adj_int_dev[piVar42[0x10]];
  piVar42[0x38] = iVar16 + iVar17;
  iVar18 = piVar42[0x39];
  iVar19 = borg_adj_wis_sav[piVar42[0x11]];
  piVar42[0x39] = iVar18 + iVar19;
  piVar42[0x36] = (ppVar21->x_skills[0] * iVar35) / 10 + iVar44 + iVar13;
  piVar42[0x37] = (ppVar21->x_skills[1] * iVar35) / 10 + iVar14 + iVar15;
  iVar44 = (ppVar21->x_skills[2] * iVar35) / 10 + iVar16 + iVar17;
  piVar42[0x38] = iVar44;
  piVar42[0x39] = (ppVar21->x_skills[3] * iVar35) / 10 + iVar18 + iVar19;
  iVar40 = iVar40 + (ppVar21->x_skills[5] * iVar35) / 10 + 1;
  piVar42[0x3a] = iVar40;
  piVar42[0x3b] = piVar42[0x3b] + (ppVar21->x_skills[4] * iVar35) / 10;
  piVar42[0x3c] = piVar42[0x3c] + (ppVar21->x_skills[6] * iVar35) / 10;
  piVar42[0x3d] = piVar42[0x3d] + (ppVar21->x_skills[7] * iVar35) / 10;
  piVar42[0x3e] = piVar42[0x3e] + (iVar35 * ppVar21->x_skills[8]) / 10;
  if (iVar40 < 0x1f) {
    if (iVar40 < 0) {
      local_74 = 0;
      goto LAB_00239be1;
    }
  }
  else {
LAB_00239be1:
    piVar42[0x3a] = local_74;
  }
  if (piVar42[0x3f] < 1) {
    piVar42[0x3f] = 1;
  }
  if ((piVar42[0x71] != 0) || (piVar42[0xba] != 0)) {
    *(ulong *)(piVar42 + 0x85) =
         CONCAT44((int)((ulong)*(undefined8 *)(piVar42 + 0x85) >> 0x20) + -0x14,
                  (int)*(undefined8 *)(piVar42 + 0x85) + 8);
    piVar42[0x38] = (iVar44 * 0x5f) / 100;
  }
  _Var29 = flag_has_dbg((player->state).pflags,3,3,"player->state.pflags","(PF_BLESS_WEAPON)");
  if ((_Var29) &&
     ((pbVar2->tval == '\a' ||
      (_Var29 = flag_has_dbg(pbVar2->flags,5,0x12,"item->flags","OF_BLESSED"), _Var29)))) {
    *(ulong *)(borg.trait + 0x86) =
         CONCAT44((int)((ulong)*(undefined8 *)(borg.trait + 0x86) >> 0x20) + 2,
                  (int)*(undefined8 *)(borg.trait + 0x86) + 2);
  }
  uVar33 = z_info->pack_size;
  uVar45 = (ulong)uVar33;
  lVar43 = uVar45 * 0x388;
  paVar39 = z_info;
  while( true ) {
    pbVar47 = borg_items;
    uVar50 = (ulong)uVar33;
    if (uVar50 + 1 < uVar45) break;
    if ((((borg_items->curses[lVar43 + -0x26] != false) &&
         (borg_items->curses[lVar43 + -0x2e] == true)) &&
        (_Var29 = cursed_nonartifact((borg_item *)(borg_items->desc + lVar43)), !_Var29)) &&
       (((uVar45 != uVar50 + 1 || (2 < borg.trait[0x9a])) ||
        ((pbVar47->curses[lVar43 + -0x22] != false || (pbVar47->curses[lVar43 + -0x21] != false)))))
       ) {
      _Var29 = borg_spell_legal_fail(ENCHANT_WEAPON,L'A');
      piVar1 = borg_cfg;
      piVar42 = borg.trait;
      paVar39 = z_info;
      if ((_Var29) || (0 < borg.trait[0xec])) {
        iVar40 = borg_cfg[0x1c];
        iVar35 = iVar40 - *(short *)(pbVar47->curses + lVar43 + -0x16);
        if (iVar35 != 0 && *(short *)(pbVar47->curses + lVar43 + -0x16) <= iVar40) {
          borg.trait[0xf1] = borg.trait[0xf1] + iVar35;
          iVar40 = piVar1[0x1c];
        }
        iVar35 = iVar40 - *(short *)(pbVar47->curses + lVar43 + -0x14);
        if (iVar35 != 0 && *(short *)(pbVar47->curses + lVar43 + -0x14) <= iVar40) {
          borg.trait[0xf2] = borg.trait[0xf2] + iVar35;
        }
      }
      else {
        if (*(short *)(pbVar47->curses + lVar43 + -0x16) < 8) {
          borg.trait[0xf1] =
               (borg.trait[0xf1] - (int)*(short *)(pbVar47->curses + lVar43 + -0x16)) + 8;
        }
        if (*(short *)(pbVar47->curses + lVar43 + -0x14) < 8) {
          piVar42[0xf2] = (piVar42[0xf2] - (int)*(short *)(pbVar47->curses + lVar43 + -0x14)) + 8;
        }
      }
    }
    uVar45 = uVar45 + 1;
    uVar33 = paVar39->pack_size;
    lVar43 = lVar43 + 0x388;
  }
  lVar43 = uVar50 * 0x388 + 0x1530;
  for (uVar50 = uVar50 + 6; piVar42 = borg.trait, pbVar47 = borg_items,
      uVar50 <= (ulong)uVar33 + 0xb; uVar50 = uVar50 + 1) {
    if (((borg_items->curses[lVar43 + -0x26] != false) &&
        (borg_items->curses[lVar43 + -0x2e] == true)) &&
       (_Var29 = cursed_nonartifact((borg_item *)(borg_items->desc + lVar43)), !_Var29)) {
      _Var29 = borg_spell_legal_fail(ENCHANT_ARMOUR,L'A');
      paVar39 = z_info;
      if ((_Var29) || (0 < borg.trait[0xee])) {
        iVar35 = (int)*(short *)(pbVar47->curses + lVar43 + -0x12);
        iVar40 = borg_cfg[0x1c] - iVar35;
        if (iVar40 != 0 && iVar35 <= borg_cfg[0x1c]) {
          borg.trait[0xf0] = borg.trait[0xf0] + iVar40;
        }
      }
      else {
        iVar40 = (int)*(short *)(pbVar47->curses + lVar43 + -0x12);
        if (iVar40 < 8) {
          borg.trait[0xf0] = (borg.trait[0xf0] - iVar40) + 8;
        }
      }
    }
    uVar33 = paVar39->pack_size;
    lVar43 = lVar43 + 0x388;
  }
  if (0 < borg.see_inv) {
    borg.trait[0x33] = 1;
  }
  if ((piVar42[0x69] == 0) &&
     (_Var29 = borg_spell_legal(SENSE_INVISIBLE), piVar42 = borg.trait, _Var29)) {
    borg.trait[0x33] = 1;
  }
  if (((99 < piVar42[0x39]) && (piVar42[0x56] = 1, piVar42[0x4c] != 0)) && (piVar42[0x4b] != 0)) {
    piVar42[0x4d] = 1;
  }
  uVar33 = z_info->pack_size;
  for (wVar36 = (uint)uVar33 + L'\f'; paVar39 = z_info,
      (uint)wVar36 < (uint)((uint)uVar33 + (uint)z_info->quiver_size + L'\f');
      wVar36 = wVar36 + L'\x01') {
    borg_notice_ammo(wVar36);
    uVar33 = z_info->pack_size;
  }
  for (lVar43 = -5; lVar43 != 0; lVar43 = lVar43 + 1) {
    *(undefined1 *)((long)borg.amt_statgain + lVar43 + -1) = 0;
    borg.amt_statgain[lVar43 + 5] = 0;
  }
  for (lVar43 = 0; lVar43 != 9; lVar43 = lVar43 + 1) {
    borg.amt_book[lVar43] = 0;
  }
  lVar46 = 0;
  for (lVar43 = 0; pbVar47 = borg_items,
      lVar43 < (long)((ulong)paVar39->pack_size - (long)borg.trait[0x9e]); lVar43 = lVar43 + 1) {
    if (borg_items->curses[lVar46 + -0x26] == false) {
      borg.trait[0x106] = borg.trait[0x106] + 1;
    }
    else {
      _Var29 = borg_is_ammo((uint)borg_items->curses[lVar46 + -0x2a]);
      if (_Var29) {
        borg_notice_ammo((wchar_t)lVar43);
      }
      else {
        pbVar2 = (borg_item *)(pbVar47->desc + lVar46);
        iVar31 = borg_item_weight((borg_item_conflict *)pbVar2);
        borg.trait[0x104] = borg.trait[0x104] + (int)iVar31;
        _Var29 = borg_item_note_needs_id((borg_item_conflict *)pbVar2);
        if (_Var29) {
          borg.trait[0xfe] = borg.trait[0xfe] + 1;
        }
        piVar42 = borg.trait;
        if ((pbVar47->curses[lVar46 + -1] == true) &&
           (borg.trait[0xa0] = borg.trait[0xa0] | 1, piVar42[0x9f] == 0)) {
          piVar42[0x9f] = (wchar_t)lVar43 + L'\x01';
        }
        if (pbVar47->curses[lVar46 + -0x2c] == true) {
          _Var29 = pbVar47->curses[lVar46 + -0x26];
          borg.has[*(uint *)(pbVar47->curses + lVar46 + -0x32)] =
               borg.has[*(uint *)(pbVar47->curses + lVar46 + -0x32)] + (uint)_Var29;
          _Var30 = cursed_nonartifact(pbVar2);
          piVar42 = borg.trait;
          if ((!_Var30) && (pbVar47->curses[lVar46 + -0x2a] - 6 < 0x1d)) {
            uVar34 = (uint)_Var29;
            uVar49 = (uint)_Var29;
            uVar48 = (uint)_Var29;
            switch((uint)pbVar47->curses[lVar46 + -0x2a]) {
            case 6:
              if (((0 < *(int *)(pbVar47->curses + lVar46 + -6)) &&
                  (pbVar47->curses[lVar46 + -2] == false)) && (0xc < borg.trait[0x3f])) {
                borg.trait[0xff] = borg.trait[0xff] + uVar49;
              }
              break;
            case 0x13:
              if ((((sv_light_torch == (uint)pbVar47->curses[lVar46 + -0x29]) &&
                   (0 < *(short *)(pbVar47->curses + lVar46 + -0x18))) &&
                  (pbVar47->curses[lVar46 + -0x29] ==
                   (_Bool)borg_items[(ulong)z_info->pack_size + 5].sval)) &&
                 (borg_items[(ulong)z_info->pack_size + 5].iqty != '\0')) {
LAB_0023a265:
                borg.trait[0xd5] = borg.trait[0xd5] + uVar49;
              }
              break;
            case 0x16:
              _Var29 = pbVar47->curses[lVar46 + -0x29];
              if (sv_staff_teleportation == (uint)_Var29) {
                borg.trait[0xd4] = borg.trait[0xd4] + uVar34;
                wVar36 = borg_activate_failure(L'\x16',(uint)_Var29);
                if (wVar36 < L'Ǵ') {
                  borg.trait[0xd4] =
                       borg.trait[0xd4] + (int)*(short *)(pbVar47->curses + lVar46 + -0x28);
                }
              }
              else if (sv_staff_speed == (uint)_Var29) {
                iVar40 = (int)*(short *)(pbVar47->curses + lVar46 + -0x28);
LAB_0023a47e:
                borg.trait[0xda] = borg.trait[0xda] + iVar40;
              }
              else {
                wVar36 = (wchar_t)_Var29;
                if (sv_staff_healing == wVar36) {
                  borg.trait[0xd6] =
                       borg.trait[0xd6] + (int)*(short *)(pbVar47->curses + lVar46 + -0x28);
                }
                else if (sv_staff_the_magi == wVar36) {
                  borg.trait[0xdb] =
                       borg.trait[0xdb] + (int)*(short *)(pbVar47->curses + lVar46 + -0x28);
                }
                else if (sv_staff_destruction == wVar36) {
                  borg.trait[0xdc] =
                       borg.trait[0xdc] + (int)*(short *)(pbVar47->curses + lVar46 + -0x28);
                }
                else if (sv_staff_power == wVar36) {
                  borg.trait[0x100] = borg.trait[0x100] + uVar34;
                }
                else if (sv_staff_holiness == (uint)_Var29) {
                  borg.trait[0x100] = borg.trait[0x100] + uVar34;
                  piVar42[0xd6] = piVar42[0xd6] + (int)*(short *)(pbVar47->curses + lVar46 + -0x28);
                }
              }
              break;
            case 0x17:
              _Var29 = pbVar47->curses[lVar46 + -0x29];
              if (sv_wand_teleport_away == (uint)_Var29) {
                borg.trait[0xdd] =
                     borg.trait[0xdd] + (int)*(short *)(pbVar47->curses + lVar46 + -0x28);
              }
              if ((sv_wand_stinking_cloud == (uint)_Var29) && (borg.trait[0x6a] < 0x1e)) {
                borg.trait[0x101] =
                     borg.trait[0x101] + (int)*(short *)(pbVar47->curses + lVar46 + -0x28);
              }
              if ((sv_wand_magic_missile == (uint)_Var29) && (borg.trait[0x6a] < 0x1e)) {
                borg.trait[0x101] =
                     borg.trait[0x101] + (int)*(short *)(pbVar47->curses + lVar46 + -0x28);
              }
              if (sv_wand_annihilation == (uint)_Var29) {
                borg.trait[0x101] =
                     borg.trait[0x101] + (int)*(short *)(pbVar47->curses + lVar46 + -0x28);
              }
              break;
            case 0x18:
              _Var29 = pbVar47->curses[lVar46 + -0x29];
              wVar36 = (wchar_t)_Var29;
              if (sv_rod_recall == (uint)_Var29) {
                wVar36 = borg_activate_failure(L'\x18',wVar36);
                if (wVar36 < L'Ǵ') {
                  borg.trait[0x26] = borg.trait[0x26] + (uint)pbVar47->curses[lVar46 + -0x26] * 100;
                }
                else {
                  borg.trait[0x26] = borg.trait[0x26] + (uint)pbVar47->curses[lVar46 + -0x26];
                }
              }
              else if (sv_rod_detection == (uint)_Var29) {
                iVar40 = uVar34 * 100;
                *(ulong *)(borg.trait + 0xdf) =
                     CONCAT44(iVar40 + (int)((ulong)*(undefined8 *)(borg.trait + 0xdf) >> 0x20),
                              iVar40 + (int)*(undefined8 *)(borg.trait + 0xdf));
                piVar42[0xe1] = piVar42[0xe1] + iVar40;
              }
              else {
                wVar37 = (wchar_t)_Var29;
                if (sv_rod_illumination == wVar37) {
                  borg.trait[0xe4] = borg.trait[0xe4] + uVar34 * 100;
                }
                else if (sv_rod_speed == wVar37) {
                  wVar36 = borg_activate_failure(L'\x18',wVar36);
                  if (wVar36 < L'Ǵ') {
                    iVar40 = (uint)pbVar47->curses[lVar46 + -0x26] * 100;
                    goto LAB_0023a47e;
                  }
                  borg.trait[0xda] = borg.trait[0xda] + (uint)pbVar47->curses[lVar46 + -0x26];
                }
                else if (sv_rod_mapping == wVar37) {
                  borg.trait[0xe2] = borg.trait[0xe2] + uVar34 * 100;
                }
                else if (sv_rod_healing == wVar37) {
                  wVar36 = borg_activate_failure(L'\x18',wVar36);
                  if (wVar36 < L'Ǵ') {
                    borg.trait[0xd6] = borg.trait[0xd6] + (uint)pbVar47->curses[lVar46 + -0x26] * 3;
                  }
                  else {
                    borg.trait[0xd6] = (uint)pbVar47->curses[lVar46 + -0x26] + borg.trait[0xd6] + 1;
                  }
                }
                else if ((((sv_rod_light == wVar37) || (sv_rod_fire_bolt == wVar37)) ||
                         (sv_rod_elec_bolt == wVar37)) ||
                        ((sv_rod_cold_bolt == wVar37 || (sv_rod_acid_bolt == wVar36)))) {
                  borg.trait[0xfb] = borg.trait[0xfb] + uVar48;
                }
                else if (((sv_rod_drain_life == wVar36) || (sv_rod_fire_ball == wVar36)) ||
                        ((sv_rod_elec_ball == wVar36 ||
                         ((sv_rod_cold_ball == wVar36 || (sv_rod_acid_ball == wVar36)))))) {
                  borg.trait[0xfc] = borg.trait[0xfc] + uVar48;
                }
              }
              break;
            case 0x19:
              _Var29 = pbVar47->curses[lVar46 + -0x29];
              if (sv_scroll_identify == (uint)_Var29) {
                borg.trait[0xd9] = borg.trait[0xd9] + uVar48;
              }
              else if (sv_scroll_recharging == (uint)_Var29) {
                borg.trait[0xe3] = borg.trait[0xe3] + uVar48;
              }
              else {
                wVar36 = (wchar_t)_Var29;
                if (sv_scroll_phase_door == wVar36) {
                  borg.trait[0xd2] = borg.trait[0xd2] + uVar48;
                }
                else if (sv_scroll_teleport == wVar36) {
                  borg.trait[0xd3] = borg.trait[0xd3] + uVar48;
                }
                else if (sv_scroll_word_of_recall == wVar36) {
                  borg.trait[0x26] = borg.trait[0x26] + uVar48;
                }
                else if (sv_scroll_enchant_armor == wVar36) {
                  borg.trait[0xed] = borg.trait[0xed] + uVar48;
                }
                else {
                  wVar36 = (wchar_t)_Var29;
                  if (sv_scroll_star_enchant_armor == wVar36) {
                    borg.trait[0xee] = borg.trait[0xee] + uVar48;
                  }
                  else if (sv_scroll_enchant_weapon_to_hit == wVar36) {
                    borg.trait[0xea] = borg.trait[0xea] + uVar48;
                  }
                  else if (sv_scroll_enchant_weapon_to_dam == wVar36) {
                    borg.trait[0xeb] = borg.trait[0xeb] + uVar48;
                  }
                  else if (sv_scroll_star_enchant_weapon == wVar36) {
                    borg.trait[0xec] = borg.trait[0xec] + uVar48;
                  }
                  else if (sv_scroll_protection_from_evil == wVar36) {
                    borg.trait[0xe5] = borg.trait[0xe5] + uVar48;
                  }
                  else if (sv_scroll_rune_of_protection == wVar36) {
                    borg.trait[0xe6] = borg.trait[0xe6] + uVar48;
                  }
                  else if (sv_scroll_teleport_level == wVar36) {
                    borg.trait[0xf7] = borg.trait[0xf7] + uVar49;
                    piVar42[0xd3] = piVar42[0xd3] + 1;
                  }
                  else if (sv_scroll_mass_banishment == wVar36) {
                    borg.trait[0xf9] = borg.trait[0xf9] + uVar49;
                  }
                }
              }
              break;
            case 0x1a:
              _Var30 = pbVar47->curses[lVar46 + -0x29];
              if (sv_potion_healing == (uint)_Var30) {
                borg.trait[0xd6] = borg.trait[0xd6] + uVar49;
              }
              else if (sv_potion_star_healing == (uint)_Var30) {
                borg.trait[0xd7] = borg.trait[0xd7] + uVar49;
              }
              else {
                wVar36 = (wchar_t)_Var30;
                if (sv_potion_life == wVar36) {
                  borg.trait[0xd8] = borg.trait[0xd8] + uVar49;
                }
                else if (sv_potion_cure_critical == wVar36) {
                  borg.trait[0xe7] = borg.trait[0xe7] + uVar49;
                }
                else if (sv_potion_cure_serious == wVar36) {
                  borg.trait[0xe8] = borg.trait[0xe8] + uVar49;
                }
                else if (sv_potion_cure_light == wVar36) {
                  borg.trait[0xe9] = borg.trait[0xe9] + uVar49;
                }
                else {
                  wVar36 = (wchar_t)_Var30;
                  if (sv_potion_cure_poison == wVar36) {
                    borg.trait[0xde] = borg.trait[0xde] + uVar49;
                  }
                  else if (sv_potion_resist_heat == wVar36) {
                    borg.trait[0xf4] = borg.trait[0xf4] + uVar49;
                  }
                  else if (sv_potion_resist_cold == wVar36) {
                    borg.trait[0xf5] = borg.trait[0xf5] + uVar49;
                  }
                  else if (sv_potion_resist_pois == wVar36) {
                    borg.trait[0xf6] = borg.trait[0xf6] + uVar49;
                  }
                  else {
                    uVar33 = (ushort)_Var29;
                    if (sv_potion_inc_str == wVar36) {
                      borg.amt_statgain[0] = borg.amt_statgain[0] + uVar33;
                    }
                    else if (sv_potion_inc_int == wVar36) {
                      borg.amt_statgain[1] = borg.amt_statgain[1] + uVar33;
                    }
                    else if (sv_potion_inc_wis == wVar36) {
                      borg.amt_statgain[2] = borg.amt_statgain[2] + uVar33;
                    }
                    else if (sv_potion_inc_dex == wVar36) {
                      borg.amt_statgain[3] = borg.amt_statgain[3] + uVar33;
                    }
                    else {
                      wVar36 = (wchar_t)_Var30;
                      if (sv_potion_inc_con != wVar36) {
                        if (sv_potion_inc_all != wVar36) {
                          if (sv_potion_restore_life == wVar36) {
                            borg.trait[0x7e] = 1;
                          }
                          else if (sv_potion_speed == wVar36) {
                            borg.trait[0xda] = borg.trait[0xda] + uVar49;
                          }
                          break;
                        }
                        auVar56 = pshuflw(ZEXT416(uVar49),ZEXT416(uVar49),0);
                        borg.amt_statgain[0] = auVar56._0_2_ + borg.amt_statgain[0];
                        borg.amt_statgain[1] = auVar56._2_2_ + borg.amt_statgain[1];
                        borg.amt_statgain[2] = auVar56._4_2_ + borg.amt_statgain[2];
                        borg.amt_statgain[3] = auVar56._6_2_ + borg.amt_statgain[3];
                      }
                      borg.amt_statgain[4] = borg.amt_statgain[4] + uVar33;
                    }
                  }
                }
              }
              break;
            case 0x1b:
              if (sv_light_lantern == (uint)borg_items[(ulong)z_info->pack_size + 5].sval)
              goto LAB_0023a265;
              break;
            case 0x1c:
switchD_0023a0b5_caseD_1c:
              _Var29 = borg_obj_has_effect(*(uint32_t *)(pbVar47->curses + lVar46 + -0x32),L'\a',
                                           L'\xffffffff');
              if ((!_Var29) &&
                 (_Var29 = borg_obj_has_effect(*(uint32_t *)(pbVar47->curses + lVar46 + -0x32),L'\n'
                                               ,L'\x04'), !_Var29)) {
                if (pbVar47->curses[lVar46 + -0x2a] == true) {
                  _Var29 = borg_obj_has_effect(*(uint32_t *)(pbVar47->curses + lVar46 + -0x32),
                                               L'\x06',L'\0');
                  lVar41 = 0xa4;
                  if (_Var29) {
LAB_0023a636:
                    *(int *)((long)borg.trait + lVar41) =
                         *(int *)((long)borg.trait + lVar41) + (uint)pbVar47->curses[lVar46 + -0x26]
                    ;
                  }
                }
                else {
                  _Var29 = pbVar47->curses[lVar46 + -0x29];
                  lVar41 = 0xa4;
                  if ((((((sv_food_apple == (uint)_Var29) || (sv_food_handful == (uint)_Var29)) ||
                        (wVar36 = (wchar_t)_Var29, sv_food_slime_mold == wVar36)) ||
                       (((sv_food_pint == wVar36 || (sv_food_sip == wVar36)) ||
                        ((lVar41 = 0xa0, sv_food_ration == wVar36 ||
                         ((wVar36 = (wchar_t)_Var29, sv_food_slice == wVar36 ||
                          (sv_food_honey_cake == wVar36)))))))) || (sv_food_waybread == wVar36)) ||
                     (sv_food_draught == wVar36)) goto LAB_0023a636;
                }
                _Var29 = borg_obj_has_effect(*(uint32_t *)(pbVar47->curses + lVar46 + -0x32),L'\b',
                                             L'\a');
                if (_Var29) {
                  borg.trait[0xde] = borg.trait[0xde] + (uint)pbVar47->curses[lVar46 + -0x26];
                }
                _Var29 = borg_obj_has_effect(*(uint32_t *)(pbVar47->curses + lVar46 + -0x32),L'\b',
                                             L'\x04');
                if (_Var29) {
                  borg.trait[0x2a] = borg.trait[0x2a] + (uint)pbVar47->curses[lVar46 + -0x26];
                }
                _Var29 = borg_obj_has_effect(*(uint32_t *)(pbVar47->curses + lVar46 + -0x32),L'\b',
                                             L'\x02');
                if (_Var29) {
                  borg.trait[0x2b] = borg.trait[0x2b] + (uint)pbVar47->curses[lVar46 + -0x26];
                }
              }
              break;
            case 0x1d:
              _Var30 = pbVar47->curses[lVar46 + -0x29];
              wVar36 = (wchar_t)_Var30;
              if ((((sv_mush_purging != (uint)_Var30) && (sv_mush_restoring != (uint)_Var30)) &&
                  (sv_mush_cure_mind != wVar36)) ||
                 ((borg_cfg[1] == 0 || (borg_cfg[2] <= borg.trait[0x24])))) {
                if (((((sv_mush_second_sight == wVar36) ||
                      ((wVar37 = (wchar_t)_Var30, sv_mush_emergency == wVar37 ||
                       (sv_mush_terror == wVar37)))) || (sv_mush_stoneskin == wVar37)) ||
                    ((sv_mush_debility == wVar37 || (sv_mush_sprinting == wVar36)))) &&
                   ((borg_cfg[1] != 0 && (borg_cfg[2] <= borg.trait[0x24])))) {
                  borg.trait[0xfa] = borg.trait[0xfa] + (uint)_Var29;
                }
                goto switchD_0023a0b5_caseD_1c;
              }
              break;
            case 0x1e:
            case 0x1f:
            case 0x20:
            case 0x21:
            case 0x22:
              _Var29 = obj_kind_can_browse(k_info + *(uint *)(pbVar47->curses + lVar46 + -0x32));
              if (_Var29) {
                _Var29 = pbVar47->curses[lVar46 + -0x26];
                wVar36 = borg_get_book_num((uint)pbVar47->curses[lVar46 + -0x29]);
                borg.amt_book[wVar36] = borg.amt_book[wVar36] + (ushort)_Var29;
              }
            }
          }
        }
      }
    }
    lVar46 = lVar46 + 0x388;
    paVar39 = z_info;
  }
  iVar40 = borg.has[kv_flask_oil];
  if ((iVar40 != 0) && (borg.trait[0x23] < 0xf)) {
    iVar35 = 0xf;
    if (iVar40 < 0xf) {
      iVar35 = iVar40;
    }
    borg.trait[0x9b] = borg.trait[0x9b] + iVar35;
  }
  _Var29 = borg_spell_legal_fail(REMOVE_HUNGER,L'P');
  if ((_Var29) || (_Var29 = borg_spell_legal_fail(HERBAL_CURING,L'P'), _Var29)) {
    borg.trait[0x27] = borg.trait[0x27] + 1000;
  }
  _Var29 = borg_spell_legal(IDENTIFY_RUNE);
  if (_Var29) {
    borg.trait[0xd9] = borg.trait[0xd9] + 1000;
  }
  _Var29 = borg_spell_legal(FIND_TRAPS_DOORS_STAIRS);
  if ((_Var29) || (_Var29 = borg_spell_legal(DETECTION), _Var29)) {
    borg.trait[0xdf] = 1000;
  }
  _Var29 = borg_spell_legal(REVEAL_MONSTERS);
  if ((((_Var29) || (_Var29 = borg_spell_legal(DETECT_LIFE), _Var29)) ||
      (_Var29 = borg_spell_legal(DETECT_EVIL), _Var29)) ||
     (((_Var29 = borg_spell_legal(READ_MINDS), _Var29 ||
       (_Var29 = borg_spell_legal(DETECT_MONSTERS), _Var29)) ||
      (_Var29 = borg_spell_legal(SEEK_BATTLE), _Var29)))) {
    borg.trait[0xe1] = 1000;
  }
  _Var29 = borg_spell_legal(DETECTION);
  if (((_Var29) || (_Var29 = borg_equips_item(act_enlightenment,false), _Var29)) ||
     (_Var29 = borg_equips_item(act_clairvoyance,false), _Var29)) {
    piVar42 = borg.trait;
    piVar42[0xdf] = 1000;
    piVar42[0xe0] = 1000;
    piVar42[0xe1] = 1000;
  }
  _Var29 = borg_spell_legal(SENSE_INVISIBLE);
  if (_Var29) {
    borg.trait[0x103] = 1;
  }
  _Var29 = borg_spell_legal(SENSE_SURROUNDINGS);
  if (((_Var29) || (_Var29 = borg_equips_item(act_detect_all,false), _Var29)) ||
     (_Var29 = borg_equips_item(act_mapping,false), _Var29)) {
    piVar42 = borg.trait;
    piVar42[0xdf] = 1000;
    piVar42[0xe0] = 1000;
    piVar42[0xe2] = 1000;
  }
  _Var29 = borg_spell_legal(LIGHT_ROOM);
  if (((_Var29) || (_Var29 = borg_equips_item(act_light,false), _Var29)) ||
     ((_Var29 = borg_equips_item(act_illumination,false), _Var29 ||
      (_Var29 = borg_spell_legal(CALL_LIGHT), _Var29)))) {
    borg.trait[0xe4] = borg.trait[0xe4] + 1000;
  }
  _Var29 = borg_spell_legal(PROTECTION_FROM_EVIL);
  if (((_Var29) || (_Var29 = borg_equips_item(act_protevil,false), _Var29)) ||
     ((borg.has[kv_staff_holiness] != 0 || (_Var29 = borg_equips_item(act_staff_holy,false), _Var29)
      ))) {
    borg.trait[0xe5] = borg.trait[0xe5] + 1000;
  }
  _Var29 = borg_spell_legal(GLYPH_OF_WARDING);
  if ((_Var29) || (_Var29 = borg_equips_item(act_glyph,false), _Var29)) {
    borg.trait[0xe6] = borg.trait[0xe6] + 1000;
  }
  _Var29 = borg_spell_legal(FIND_TRAPS_DOORS_STAIRS);
  if (_Var29) {
    piVar42 = borg.trait;
    piVar42[0xdf] = 1000;
    piVar42[0xe0] = 1000;
  }
  _Var29 = borg_spell_legal_fail(ENCHANT_WEAPON,L'A');
  if ((_Var29) || (_Var29 = borg_equips_item(act_enchant_weapon,false), _Var29)) {
    piVar42 = borg.trait;
    *(ulong *)(borg.trait + 0xea) =
         CONCAT44((int)((ulong)*(undefined8 *)(borg.trait + 0xea) >> 0x20) + 1000,
                  (int)*(undefined8 *)(borg.trait + 0xea) + 1000);
    piVar42[0xec] = piVar42[0xec] + 1000;
  }
  _Var29 = borg_equips_item(act_enchant_tohit,false);
  if (_Var29) {
    borg.trait[0xea] = borg.trait[0xea] + 1000;
  }
  _Var29 = borg_equips_item(act_enchant_todam,false);
  if (_Var29) {
    borg.trait[0xeb] = borg.trait[0xeb] + 1000;
  }
  _Var29 = borg_equips_item(act_firebrand,false);
  if ((_Var29) || (_Var29 = borg_spell_legal_fail(BRAND_AMMUNITION,L'A'), _Var29)) {
    borg.trait[0xef] = borg.trait[0xef] + 1000;
  }
  _Var29 = borg_spell_legal_fail(ENCHANT_ARMOUR,L'A');
  if (((_Var29) || (_Var29 = borg_equips_item(act_enchant_armor,false), _Var29)) ||
     (_Var29 = borg_equips_item(act_enchant_armor2,false), _Var29)) {
    *(ulong *)(borg.trait + 0xed) =
         CONCAT44((int)((ulong)*(undefined8 *)(borg.trait + 0xed) >> 0x20) + 1000,
                  (int)*(undefined8 *)(borg.trait + 0xed) + 1000);
  }
  _Var29 = borg_spell_legal_fail(TURN_STONE_TO_MUD,L'(');
  if (((_Var29) || (_Var29 = borg_equips_item(act_stone_to_mud,false), _Var29)) ||
     (_Var29 = borg_equips_ring(sv_ring_digging), _Var29)) {
    borg.trait[0xff] = borg.trait[0xff] + 1;
  }
  _Var29 = borg_spell_legal_fail(WORD_OF_RECALL,L'(');
  if ((_Var29) || ((borg.trait[0x69] == 100 && (_Var29 = borg_spell_legal(WORD_OF_RECALL), _Var29)))
     ) {
    borg.trait[0x26] = borg.trait[0x26] + 1000;
  }
  _Var29 = borg_equips_item(act_recall,false);
  if (_Var29) {
    borg.trait[0x26] = borg.trait[0x26] + 1;
  }
  _Var29 = borg_spell_legal_fail(TELEPORT_LEVEL,L'\x14');
  if (_Var29) {
    borg.trait[0xf7] = borg.trait[0xf7] + 1000;
  }
  _Var29 = borg_spell_legal_fail(PHASE_DOOR,L'\x03');
  if (_Var29) {
    borg.trait[0xd2] = borg.trait[0xd2] + 1000;
  }
  _Var29 = borg_equips_item(act_tele_phase,false);
  if (_Var29) {
    borg.trait[0xd2] = borg.trait[0xd2] + 1;
  }
  uVar34 = 1;
  _Var29 = borg_spell_legal_fail(TELEPORT_SELF,L'\x01');
  if ((((_Var29) || (_Var29 = borg_spell_legal_fail(PORTAL,L'\x01'), _Var29)) ||
      (_Var29 = borg_spell_legal_fail(SHADOW_SHIFT,L'\x01'), _Var29)) ||
     (_Var29 = borg_spell_legal_fail(DIMENSION_DOOR,L'\x01'), _Var29)) {
    borg.trait[0xd3] = borg.trait[0xd3] + 1000;
  }
  _Var29 = borg_equips_item(act_tele_long,false);
  if (_Var29) {
    *(ulong *)(borg.trait + 0xd3) =
         CONCAT44((int)((ulong)*(undefined8 *)(borg.trait + 0xd3) >> 0x20) + 1,
                  (int)*(undefined8 *)(borg.trait + 0xd3) + 1);
  }
  _Var29 = borg_spell_legal_fail(TELEPORT_OTHER,L'(');
  if (_Var29) {
    borg.trait[0xdd] = borg.trait[0xdd] + 1000;
  }
  _Var29 = borg_spell_legal(HOLY_WORD);
  if (_Var29) {
    borg.trait[0xf8] = borg.trait[0xf8] + 1000;
  }
  _Var29 = borg_spell_legal(HASTE_SELF);
  if (((_Var29) || (_Var29 = borg_equips_item(act_haste,false), _Var29)) ||
     ((_Var29 = borg_equips_item(act_haste1,false), _Var29 ||
      (_Var29 = borg_equips_item(act_haste2,false), _Var29)))) {
    borg.trait[0xda] = borg.trait[0xda] + 1000;
  }
  _Var29 = borg_equips_item(act_cure_light,false);
  if (_Var29) {
    borg.trait[0xe9] = borg.trait[0xe9] + 1000;
  }
  _Var29 = borg_equips_item(act_cure_serious,false);
  if (_Var29) {
    borg.trait[0xe8] = borg.trait[0xe8] + 1000;
  }
  _Var29 = borg_equips_item(act_cure_critical,false);
  if (_Var29) {
    borg.trait[0xe7] = borg.trait[0xe7] + 1000;
  }
  _Var29 = borg_equips_item(act_cure_full,false);
  if (((_Var29) || (_Var29 = borg_equips_item(act_cure_full2,false), _Var29)) ||
     (((_Var29 = borg_equips_item(act_cure_nonorlybig,false), _Var29 ||
       (((_Var29 = borg_equips_item(act_heal1,false), _Var29 ||
         (_Var29 = borg_equips_item(act_heal2,false), _Var29)) ||
        (_Var29 = borg_equips_item(act_heal3,false), _Var29)))) ||
      (_Var29 = borg_spell_legal(HEALING), _Var29)))) {
    borg.trait[0xd6] = borg.trait[0xd6] + 1000;
  }
  _Var29 = borg_equips_item(act_cure_nonorlybig,false);
  if (((_Var29) || (_Var29 = borg_equips_item(act_restore_exp,false), _Var29)) ||
     ((_Var29 = borg_equips_item(act_restore_st_lev,false), _Var29 ||
      (_Var29 = borg_equips_item(act_restore_life,false), _Var29)))) {
    borg.trait[0x7e] = 1;
  }
  _Var29 = borg_spell_legal(REMEMBRANCE);
  if (((_Var29) || (_Var29 = borg_equips_item(act_cure_nonorlybig,false), _Var29)) ||
     ((_Var29 = borg_equips_item(act_restore_exp,false), _Var29 ||
      ((_Var29 = borg_equips_item(act_restore_st_lev,false), _Var29 ||
       (_Var29 = borg_equips_item(act_restore_life,false), _Var29)))))) {
    borg.trait[0x55] = 1;
  }
  _Var29 = borg_equips_item(act_recharge,false);
  if ((_Var29) || (_Var29 = borg_spell_legal(RECHARGING), _Var29)) {
    borg.trait[0xe3] = borg.trait[0xe3] + 1000;
  }
  _Var29 = flag_has_dbg(borg_items[(ulong)z_info->pack_size + 5].flags,5,0x15,
                        "borg_items[INVEN_LIGHT].flags","OF_NO_FUEL");
  piVar42 = borg.trait;
  if ((_Var29) || (borg.trait[0x19] == 4)) {
    borg.trait[0xd5] = borg.trait[0xd5] + 1000;
  }
  if (piVar42[10] < 0x76) {
    borg.need_statgain[0] = true;
  }
  if (piVar42[0xb] < 0x76) {
    borg.need_statgain[1] = true;
  }
  if (piVar42[0xc] < 0x76) {
    borg.need_statgain[2] = true;
  }
  if (piVar42[0xd] < 0x76) {
    borg.need_statgain[3] = true;
  }
  if (piVar42[0xe] < 0x76) {
    borg.need_statgain[4] = true;
  }
  if (piVar42[0x7d] == 0) {
    piVar42[0x7e] = 1;
  }
  iVar40 = piVar42[0x27] + piVar42[0x28] + piVar42[0x29];
  piVar42[0x27] = iVar40;
  if ((piVar42[0x6c] != 0) && (999 < iVar40)) {
    piVar42[0x27] = iVar40 + -1000;
  }
  if (notice_swap) {
    borg_notice_weapon_swap();
    borg_notice_armour_swap();
    piVar42 = borg.trait;
  }
  uVar49 = uVar34;
  if (((piVar42[0x48] == 0) && (armour_swap_resist_acid == '\0')) &&
     (weapon_swap_resist_acid == '\0')) {
    _Var29 = borg_spell_legal_fail(RESISTANCE,L'\x0f');
    piVar42 = borg.trait;
    uVar49 = (uint)_Var29;
  }
  piVar42[0x5a] = uVar49;
  uVar49 = uVar34;
  if (((piVar42[0x47] == 0) && (armour_swap_resist_elec == '\0')) &&
     (weapon_swap_resist_elec == '\0')) {
    _Var29 = borg_spell_legal_fail(RESISTANCE,L'\x0f');
    piVar42 = borg.trait;
    uVar49 = (uint)_Var29;
  }
  piVar42[0x59] = uVar49;
  uVar49 = uVar34;
  if (((piVar42[0x45] == 0) && (armour_swap_resist_fire == '\0')) &&
     (weapon_swap_resist_fire == '\0')) {
    _Var29 = borg_spell_legal_fail(RESISTANCE,L'\x0f');
    piVar42 = borg.trait;
    uVar49 = (uint)_Var29;
  }
  piVar42[0x57] = uVar49;
  uVar49 = uVar34;
  if (((piVar42[0x46] == 0) && (armour_swap_resist_cold == '\0')) &&
     (weapon_swap_resist_cold == '\0')) {
    _Var29 = borg_spell_legal_fail(RESISTANCE,L'\x0f');
    piVar42 = borg.trait;
    uVar49 = (uint)_Var29;
  }
  piVar42[0x58] = uVar49;
  if (((piVar42[0x49] == 0) && (armour_swap_resist_pois == '\0')) &&
     (weapon_swap_resist_pois == '\0')) {
    _Var29 = borg_spell_legal_fail(RESIST_POISON,L'\x0f');
    uVar34 = (uint)_Var29;
    piVar42 = borg.trait;
  }
  piVar42[0x5b] = uVar34;
  auVar56 = _DAT_002767c0;
  auVar63._0_4_ = -(uint)(piVar42[0x4a] == 0);
  auVar63._4_4_ = -(uint)(piVar42[0x4b] == 0);
  auVar63._8_4_ = -(uint)(piVar42[0x4c] == 0);
  auVar63._12_4_ = -(uint)(piVar42[0x4d] == 0);
  auVar57._8_4_ = 0xffffffff;
  auVar57._0_8_ = 0xffffffffffffffff;
  auVar57._12_4_ = 0xffffffff;
  auVar59[0] = -(armour_swap_resist_fear == '\0');
  auVar59[1] = -(armour_swap_resist_fear == '\0');
  auVar59[2] = -(armour_swap_resist_fear == '\0');
  auVar59[3] = -(armour_swap_resist_fear == '\0');
  auVar59[4] = -(armour_swap_resist_light == '\0');
  auVar59[5] = -(armour_swap_resist_light == '\0');
  auVar59[6] = -(armour_swap_resist_light == '\0');
  auVar59[7] = -(armour_swap_resist_light == '\0');
  auVar59[8] = -(armour_swap_resist_dark == '\0');
  auVar59[9] = -(armour_swap_resist_dark == '\0');
  auVar59[10] = -(armour_swap_resist_dark == '\0');
  auVar59[0xb] = -(armour_swap_resist_dark == '\0');
  auVar59[0xc] = -(armour_swap_resist_blind == '\0');
  auVar59[0xd] = -(armour_swap_resist_blind == '\0');
  auVar59[0xe] = -(armour_swap_resist_blind == '\0');
  auVar59[0xf] = -(armour_swap_resist_blind == '\0');
  auVar64[0] = -(weapon_swap_resist_fear == '\0');
  auVar64[1] = -(weapon_swap_resist_fear == '\0');
  auVar64[2] = -(weapon_swap_resist_fear == '\0');
  auVar64[3] = -(weapon_swap_resist_fear == '\0');
  auVar64[4] = -(weapon_swap_resist_light == '\0');
  auVar64[5] = -(weapon_swap_resist_light == '\0');
  auVar64[6] = -(weapon_swap_resist_light == '\0');
  auVar64[7] = -(weapon_swap_resist_light == '\0');
  auVar64[8] = -(weapon_swap_resist_dark == '\0');
  auVar64[9] = -(weapon_swap_resist_dark == '\0');
  auVar64[10] = -(weapon_swap_resist_dark == '\0');
  auVar64[0xb] = -(weapon_swap_resist_dark == '\0');
  auVar64[0xc] = -(weapon_swap_resist_blind == '\0');
  auVar64[0xd] = -(weapon_swap_resist_blind == '\0');
  auVar64[0xe] = -(weapon_swap_resist_blind == '\0');
  auVar64[0xf] = -(weapon_swap_resist_blind == '\0');
  *(undefined1 (*) [16])(piVar42 + 0x5c) =
       (auVar64 ^ auVar57 | auVar59 ^ auVar57 | auVar63 ^ auVar57) & _DAT_002767c0;
  auVar60._0_4_ = -(uint)(piVar42[0x4e] == 0);
  auVar60._4_4_ = -(uint)(piVar42[0x4f] == 0);
  auVar60._8_4_ = -(uint)(piVar42[0x50] == 0);
  auVar60._12_4_ = -(uint)(piVar42[0x51] == 0);
  auVar65[0] = -(armour_swap_resist_conf == '\0');
  auVar65[1] = -(armour_swap_resist_conf == '\0');
  auVar65[2] = -(armour_swap_resist_conf == '\0');
  auVar65[3] = -(armour_swap_resist_conf == '\0');
  auVar65[4] = -(armour_swap_resist_sound == '\0');
  auVar65[5] = -(armour_swap_resist_sound == '\0');
  auVar65[6] = -(armour_swap_resist_sound == '\0');
  auVar65[7] = -(armour_swap_resist_sound == '\0');
  auVar65[8] = -(armour_swap_resist_shard == '\0');
  auVar65[9] = -(armour_swap_resist_shard == '\0');
  auVar65[10] = -(armour_swap_resist_shard == '\0');
  auVar65[0xb] = -(armour_swap_resist_shard == '\0');
  auVar65[0xc] = -(armour_swap_resist_nexus == '\0');
  auVar65[0xd] = -(armour_swap_resist_nexus == '\0');
  auVar65[0xe] = -(armour_swap_resist_nexus == '\0');
  auVar65[0xf] = -(armour_swap_resist_nexus == '\0');
  auVar61[0] = -(weapon_swap_resist_conf == '\0');
  auVar61[1] = -(weapon_swap_resist_conf == '\0');
  auVar61[2] = -(weapon_swap_resist_conf == '\0');
  auVar61[3] = -(weapon_swap_resist_conf == '\0');
  auVar61[4] = -(weapon_swap_resist_sound == '\0');
  auVar61[5] = -(weapon_swap_resist_sound == '\0');
  auVar61[6] = -(weapon_swap_resist_sound == '\0');
  auVar61[7] = -(weapon_swap_resist_sound == '\0');
  auVar61[8] = -(weapon_swap_resist_shard == '\0');
  auVar61[9] = -(weapon_swap_resist_shard == '\0');
  auVar61[10] = -(weapon_swap_resist_shard == '\0');
  auVar61[0xb] = -(weapon_swap_resist_shard == '\0');
  auVar61[0xc] = -(weapon_swap_resist_nexus == '\0');
  auVar61[0xd] = -(weapon_swap_resist_nexus == '\0');
  auVar61[0xe] = -(weapon_swap_resist_nexus == '\0');
  auVar61[0xf] = -(weapon_swap_resist_nexus == '\0');
  *(undefined1 (*) [16])(piVar42 + 0x60) =
       (auVar61 ^ auVar57 | auVar65 ^ auVar57 | auVar60 ^ auVar57) & auVar56;
  auVar66._0_4_ = -(uint)(piVar42[0x52] == 0);
  auVar66._4_4_ = -(uint)(piVar42[0x53] == 0);
  auVar66._8_4_ = -(uint)(piVar42[0x54] == 0);
  auVar66._12_4_ = -(uint)(piVar42[0x55] == 0);
  auVar62[0] = -(armour_swap_resist_neth == '\0');
  auVar62[1] = -(armour_swap_resist_neth == '\0');
  auVar62[2] = -(armour_swap_resist_neth == '\0');
  auVar62[3] = -(armour_swap_resist_neth == '\0');
  auVar62[4] = -(armour_swap_resist_chaos == '\0');
  auVar62[5] = -(armour_swap_resist_chaos == '\0');
  auVar62[6] = -(armour_swap_resist_chaos == '\0');
  auVar62[7] = -(armour_swap_resist_chaos == '\0');
  auVar62[8] = -(armour_swap_resist_disen == '\0');
  auVar62[9] = -(armour_swap_resist_disen == '\0');
  auVar62[10] = -(armour_swap_resist_disen == '\0');
  auVar62[0xb] = -(armour_swap_resist_disen == '\0');
  auVar62[0xc] = -(armour_swap_hold_life == '\0');
  auVar62[0xd] = -(armour_swap_hold_life == '\0');
  auVar62[0xe] = -(armour_swap_hold_life == '\0');
  auVar62[0xf] = -(armour_swap_hold_life == '\0');
  auVar67[0] = -(weapon_swap_resist_neth == '\0');
  auVar67[1] = -(weapon_swap_resist_neth == '\0');
  auVar67[2] = -(weapon_swap_resist_neth == '\0');
  auVar67[3] = -(weapon_swap_resist_neth == '\0');
  auVar67[4] = -(weapon_swap_resist_chaos == '\0');
  auVar67[5] = -(weapon_swap_resist_chaos == '\0');
  auVar67[6] = -(weapon_swap_resist_chaos == '\0');
  auVar67[7] = -(weapon_swap_resist_chaos == '\0');
  auVar67[8] = -(weapon_swap_resist_disen == '\0');
  auVar67[9] = -(weapon_swap_resist_disen == '\0');
  auVar67[10] = -(weapon_swap_resist_disen == '\0');
  auVar67[0xb] = -(weapon_swap_resist_disen == '\0');
  auVar67[0xc] = -(weapon_swap_hold_life == '\0');
  auVar67[0xd] = -(weapon_swap_hold_life == '\0');
  auVar67[0xe] = -(weapon_swap_hold_life == '\0');
  auVar67[0xf] = -(weapon_swap_hold_life == '\0');
  *(undefined1 (*) [16])(piVar42 + 100) =
       (auVar67 ^ auVar57 | auVar62 ^ auVar57 | auVar66 ^ auVar57) & auVar56;
  piVar42[0x68] =
       (uint)(weapon_swap_free_act != '\0' || (armour_swap_free_act != '\0' || piVar42[0x56] != 0));
  iVar40 = borg_adj_str_wgt[piVar42[0xf]];
  piVar42[0x105] = iVar40 * 100;
  iVar35 = piVar42[0x104] + iVar40 * -0x32;
  if (iVar35 == 0 || SBORROW4(piVar42[0x104],iVar40 * 0x32) != iVar35 < 0) {
    iVar40 = piVar42[0x2c];
  }
  else {
    iVar40 = piVar42[0x2c] - iVar35 / (iVar40 * 10);
    piVar42[0x2c] = iVar40;
  }
  if (iVar40 < 200) {
    borg_game_ratio = 1000;
    if (iVar40 < 0x6f) goto LAB_0023b919;
  }
  else {
    piVar42[0x2c] = 199;
    iVar40 = 199;
  }
  borg_game_ratio = (int16_t)(100000 / (ulong)(iVar40 * 10 - 1000));
LAB_0023b919:
  piVar42[0x108] = 0;
  if ((0x62 < piVar42[0x6a]) &&
     ((borg_notice_home((borg_item_conflict *)0x0,false),
      (int)num_life_true + (int)num_ezheal_true + (int)num_heal_true +
      borg.trait[0xd7] + borg.has[kv_potion_healing] + borg.trait[0xd8] < 0x1e ||
      ((int)num_speed + borg.trait[0xda] < 0xf)))) {
    borg.trait[0x108] = 1;
  }
  return;
}

Assistant:

void borg_notice(bool notice_swap)
{
    /* Clear out trait arrays */
    memset(borg.has, 0, z_info->k_max * sizeof(int));
    memset(borg.trait, 0, BI_MAX * sizeof(int));
    memset(borg.activation, 0, z_info->act_max * sizeof(int));

    /* Start with a single blow per turn */
    borg.trait[BI_BLOWS] = 1;

    /* speed starts at 110 */
    borg.trait[BI_SPEED] = 110;

    /* Reset the "ammo" attributes */
    borg.trait[BI_AMMO_TVAL] = -1;
    borg.trait[BI_AMMO_SIDES] = 4;

    /* Many of our variables are tied to borg.trait[], which is erased at the
     * the start of borg_notice().  So we must update the frame the cheat in
     * all the non inventory skills.
     */
    borg_notice_player();

    /*** Process books/spells ***/
    if (borg_do_spell) {
        borg_cheat_spells();
        borg_do_spell = false;
    }

    /* Notice the equipment */
    borg_notice_equipment();

    /* Notice the inventory */
    borg_notice_inventory();

    /* Notice and locate my swap weapon */
    if (notice_swap) {
        borg_notice_weapon_swap();
        borg_notice_armour_swap();
    }
    borg.trait[BI_SRACID]
        = borg.trait[BI_RACID] || armour_swap_resist_acid
          || weapon_swap_resist_acid
          || borg_spell_legal_fail(RESISTANCE, 15); /* Res FECAP */
    borg.trait[BI_SRELEC]
        = borg.trait[BI_RELEC] || armour_swap_resist_elec
          || weapon_swap_resist_elec
          || borg_spell_legal_fail(RESISTANCE, 15); /* Res FECAP */
    borg.trait[BI_SRFIRE]
        = borg.trait[BI_RFIRE] || armour_swap_resist_fire
          || weapon_swap_resist_fire
          || borg_spell_legal_fail(RESISTANCE, 15); /* Res FECAP */
    borg.trait[BI_SRCOLD]
        = borg.trait[BI_RCOLD] || armour_swap_resist_cold
          || weapon_swap_resist_cold
          || borg_spell_legal_fail(RESISTANCE, 15); /* Res FECAP */
    borg.trait[BI_SRPOIS]
        = borg.trait[BI_RPOIS] || armour_swap_resist_pois
          || weapon_swap_resist_pois
          || borg_spell_legal_fail(RESIST_POISON, 15); /* Res P */
    borg.trait[BI_SRFEAR] = borg.trait[BI_RFEAR] || armour_swap_resist_fear
                            || weapon_swap_resist_fear;
    borg.trait[BI_SRLITE] = borg.trait[BI_RLITE] || armour_swap_resist_light
                            || weapon_swap_resist_light;
    borg.trait[BI_SRDARK] = borg.trait[BI_RDARK] || armour_swap_resist_dark
                            || weapon_swap_resist_dark;
    borg.trait[BI_SRBLIND] = borg.trait[BI_RBLIND] || armour_swap_resist_blind
                             || weapon_swap_resist_blind;
    borg.trait[BI_SRCONF] = borg.trait[BI_RCONF] || armour_swap_resist_conf
                            || weapon_swap_resist_conf;
    borg.trait[BI_SRSND] = borg.trait[BI_RSND] || armour_swap_resist_sound
                           || weapon_swap_resist_sound;
    borg.trait[BI_SRSHRD] = borg.trait[BI_RSHRD] || armour_swap_resist_shard
                            || weapon_swap_resist_shard;
    borg.trait[BI_SRNXUS] = borg.trait[BI_RNXUS] || armour_swap_resist_nexus
                            || weapon_swap_resist_nexus;
    borg.trait[BI_SRNTHR] = borg.trait[BI_RNTHR] || armour_swap_resist_neth
                            || weapon_swap_resist_neth;
    borg.trait[BI_SRKAOS] = borg.trait[BI_RKAOS] || armour_swap_resist_chaos
                            || weapon_swap_resist_chaos;
    borg.trait[BI_SRDIS] = borg.trait[BI_RDIS] || armour_swap_resist_disen
                           || weapon_swap_resist_disen;
    borg.trait[BI_SHLIFE] = borg.trait[BI_HLIFE] || armour_swap_hold_life
                            || weapon_swap_hold_life;
    borg.trait[BI_SFRACT]
        = borg.trait[BI_FRACT] || armour_swap_free_act || weapon_swap_free_act;

    /* Apply "encumbrance" from weight */
    /* Extract the "weight limit" (in tenth pounds) */
    borg.trait[BI_CARRY] = borg_adj_str_wgt[borg.trait[BI_STR_INDEX]] * 100;

    /* Apply "encumbrance" from weight */
    if (borg.trait[BI_WEIGHT] > borg.trait[BI_CARRY] / 2)
        borg.trait[BI_SPEED]
            -= ((borg.trait[BI_WEIGHT] - (borg.trait[BI_CARRY] / 2))
                / (borg.trait[BI_CARRY] / 10));

    /* top speed */
    if (borg.trait[BI_SPEED] > 199)
        borg.trait[BI_SPEED] = 199;

    /* Check my ratio for decrementing variables */
    if (borg.trait[BI_SPEED] > 110) {
        borg_game_ratio = 100000 / (((borg.trait[BI_SPEED] - 110) * 10) + 100);
    } else {
        borg_game_ratio = 1000;
    }

    /* set if we are preparing for fighting morgoth or sauron */
    borg.trait[BI_PREP_BIG_FIGHT] = false;
    if (borg.trait[BI_MAXDEPTH] >= 99) {

        /* Examine the home */
        borg_notice_home(NULL, false);

        /* pot of healing + *healing* + life */
        int total_big_heal = borg.has[kv_potion_healing];
        total_big_heal += borg.trait[BI_AEZHEAL];
        total_big_heal += borg.trait[BI_ALIFE];

        /* plus the same at home */
        total_big_heal += num_heal_true;
        total_big_heal += num_ezheal_true;
        total_big_heal += num_life_true;

        /* want bunches of heal and speed to feel prepped for the fight */
        if (total_big_heal < 30 || (num_speed + borg.trait[BI_ASPEED]) < 15)
            borg.trait[BI_PREP_BIG_FIGHT] = true;
    }
}